

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

bool __thiscall
AbstractModuleClient::sendStimulationParams(AbstractModuleClient *this,StimulationCommand *command)

{
  byte bVar1;
  binarydata *in_stack_00000068;
  char *in_stack_00000070;
  string *in_stack_00000078;
  TrodesMsg m;
  undefined7 in_stack_ffffffffffffff50;
  TrodesMsg *in_stack_ffffffffffffff70;
  StimulationCommand *in_stack_ffffffffffffff98;
  allocator local_59;
  string local_58 [24];
  TrodesMsg *in_stack_ffffffffffffffc0;
  MlmWrap *in_stack_ffffffffffffffc8;
  
  TrodesMsg::TrodesMsg(in_stack_ffffffffffffff70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"sn",&local_59);
  StimulationCommand::encode(in_stack_ffffffffffffff98);
  TrodesMsg::addcontents<char_const*,binarydata>
            ((TrodesMsg *)m.format._0_8_,in_stack_00000078,in_stack_00000070,in_stack_00000068);
  binarydata::~binarydata((binarydata *)0x1c0fb8);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  bVar1 = MlmWrap::sendHardwareMessage(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  TrodesMsg::~TrodesMsg((TrodesMsg *)CONCAT17(bVar1,in_stack_ffffffffffffff50));
  return (bool)(bVar1 & 1);
}

Assistant:

bool AbstractModuleClient::sendStimulationParams(StimulationCommand command){
    TrodesMsg m;
    m.addcontents("sn", "SET", command.encode()); //TODO: add stimcommand obj
    return sendHardwareMessage(m);
}